

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::PeekType(TypeChecker *this,Index depth,Type *out_type)

{
  size_t sVar1;
  Index IVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  Type local_3c;
  Enum local_34;
  Label *local_30;
  Label *label;
  Type *out_type_local;
  TypeChecker *pTStack_18;
  Index depth_local;
  TypeChecker *this_local;
  
  label = (Label *)out_type;
  out_type_local._4_4_ = depth;
  pTStack_18 = this;
  local_34 = (Enum)TopLabel(this,&local_30);
  bVar3 = Failed((Result)local_34);
  if (bVar3) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    sVar1 = local_30->type_stack_limit;
    uVar6 = (ulong)out_type_local._4_4_;
    sVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    if (sVar1 + uVar6 < sVar4) {
      sVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
      pvVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         (&this->type_stack_,(sVar4 - out_type_local._4_4_) - 1);
      IVar2 = pvVar5->type_index_;
      label->label_type = pvVar5->enum_;
      *(Index *)&label->field_0x4 = IVar2;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      Type::Type(&local_3c,Any);
      label->label_type = local_3c.enum_;
      *(Index *)&label->field_0x4 = local_3c.type_index_;
      Result::Result((Result *)((long)&this_local + 4),(uint)((local_30->unreachable & 1U) == 0));
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::PeekType(Index depth, Type* out_type) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));

  if (label->type_stack_limit + depth >= type_stack_.size()) {
    *out_type = Type::Any;
    return label->unreachable ? Result::Ok : Result::Error;
  }
  *out_type = type_stack_[type_stack_.size() - depth - 1];
  return Result::Ok;
}